

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_std::utf8_moneypunct_from_wide<true>::do_curr_symbol_abi_cxx11_
          (string *__return_storage_ptr__,utf8_moneypunct_from_wide<true> *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->curr_symbol_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string do_curr_symbol() const
    {
        return curr_symbol_;
    }